

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<int,QList<int>>::emplaceValue<QList<int>>
          (Node<int,_QList<int>_> *this,QList<int> *args)

{
  long lVar1;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QList<int> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<int>::QList(in_RDI,in_stack_ffffffffffffffb8);
  QList<int>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QList<int>::~QList((QList<int> *)0x9fb8eb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }